

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.hpp
# Opt level: O2

Socket<512UL> __thiscall
ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>::
openUnicastSocket<512ul>
          (Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog> *this,
          address_v4 *addr)

{
  basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *this_00;
  socklen_t in_ECX;
  anon_enum_32 *in_RDX;
  sockaddr *__addr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Socket<512UL> SVar1;
  address local_58;
  endpoint local_34;
  
  std::make_shared<ableton::platforms::asio::Socket<512ul>::Impl,asio::io_context&>
            ((io_context *)this);
  local_58.type_._1_3_ = 0;
  local_58.type_._0_1_ = (char)*in_RDX == 0x7f;
  local_58.ipv4_address_.addr_.s_addr = (in4_addr_type)(in4_addr_type)local_58.type_;
  ::asio::basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>::
  set_option<asio::ip::detail::socket_option::multicast_enable_loopback<0,34,41,19>>
            (*(basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>> **)this,
             (multicast_enable_loopback<0,_34,_41,_19> *)&local_58);
  local_58.type_ = *in_RDX;
  local_58.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
  ::asio::basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>::
  set_option<asio::ip::detail::socket_option::network_interface<0,32,41,17>>
            (*(basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>> **)this,
             (network_interface<0,_32,_41,_17> *)&local_58);
  local_58.type_ = ipv4;
  this_00 = *(basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> **)this;
  local_58.ipv4_address_.addr_.s_addr = (in4_addr_type)*in_RDX;
  local_58.ipv6_address_.addr_.__in6_u._0_8_ = 0;
  local_58.ipv6_address_.addr_.__in6_u._8_8_ = 0;
  local_58.ipv6_address_.scope_id_ = 0;
  ::asio::ip::detail::endpoint::endpoint(&local_34,&local_58,0);
  ::asio::basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>::bind
            (this_00,(int)&local_34,__addr,in_ECX);
  SVar1.mpImpl.
  super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  SVar1.mpImpl.
  super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Socket<512UL>)
         SVar1.mpImpl.
         super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Socket<BufferSize> openUnicastSocket(const ::asio::ip::address_v4& addr)
  {
    auto socket = Socket<BufferSize>{*mpService};
    socket.mpImpl->mSocket.set_option(
      ::asio::ip::multicast::enable_loopback(addr.is_loopback()));
    socket.mpImpl->mSocket.set_option(::asio::ip::multicast::outbound_interface(addr));
    socket.mpImpl->mSocket.bind(::asio::ip::udp::endpoint{addr, 0});
    return socket;
  }